

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix4f> *value)

{
  bool bVar1;
  matrix4f v;
  matrix4f local_50;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_50.m[0][0] = 1.0;
    local_50.m[0][1] = 0.0;
    local_50.m[0][2] = 0.0;
    local_50.m[0][3] = 0.0;
    local_50.m[1][0] = 0.0;
    local_50.m[1][1] = 1.0;
    local_50.m[1][2] = 0.0;
    local_50.m[1][3] = 0.0;
    local_50.m[2][0] = 0.0;
    local_50.m[2][1] = 0.0;
    local_50.m[2][2] = 1.0;
    local_50.m[2][3] = 0.0;
    local_50.m[3][0] = 0.0;
    local_50.m[3][1] = 0.0;
    local_50.m[3][2] = 0.0;
    local_50.m[3][3] = 1.0;
    bVar1 = ParseMatrix(this,&local_50);
    if (bVar1) {
      *(ulong *)&value->contained = CONCAT44(local_50.m[0][1],local_50.m[0][0]);
      *(ulong *)((long)&value->contained + 8) = CONCAT44(local_50.m[0][3],local_50.m[0][2]);
      *(ulong *)((long)&value->contained + 0x10) = CONCAT44(local_50.m[1][1],local_50.m[1][0]);
      *(undefined8 *)((long)&value->contained + 0x18) = local_50.m[1]._8_8_;
      *(undefined8 *)((long)&value->contained + 0x20) = local_50.m[2]._0_8_;
      *(ulong *)((long)&value->contained + 0x28) = CONCAT44(local_50.m[2][3],local_50.m[2][2]);
      *(ulong *)((long)&value->contained + 0x30) = CONCAT44(local_50.m[3][1],local_50.m[3][0]);
      *(ulong *)((long)&value->contained + 0x38) = CONCAT44(local_50.m[3][3],local_50.m[3][2]);
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix4f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix4f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}